

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

VectorSet * __thiscall
AlphaVectorPlanning::CrossSum
          (VectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *A,VectorSet *B)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar2 = A->size1_;
  uVar3 = B->size1_;
  uVar1 = (uint)A->size2_;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(__return_storage_ptr__,(long)((int)uVar2 * (int)uVar3),(long)(int)uVar1);
  lVar10 = -1;
  lVar11 = 0;
  for (uVar12 = 0; uVar12 != (uVar2 & 0xffffffff); uVar12 = uVar12 + 1) {
    lVar10 = (long)(int)lVar10;
    lVar14 = 0;
    lVar13 = lVar10 * 8;
    for (uVar15 = 0; lVar13 = lVar13 + 8, uVar15 != (uVar3 & 0xffffffff); uVar15 = uVar15 + 1) {
      sVar4 = A->size2_;
      sVar5 = B->size2_;
      sVar6 = __return_storage_ptr__->size2_;
      lVar10 = lVar10 + 1;
      pdVar7 = (A->data_).data_;
      pdVar8 = (B->data_).data_;
      pdVar9 = (__return_storage_ptr__->data_).data_;
      for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
        *(double *)((long)pdVar9 + uVar16 * 8 + sVar6 * lVar13) =
             *(double *)((long)pdVar7 + uVar16 * 8 + sVar4 * lVar11) +
             *(double *)((long)pdVar8 + uVar16 * 8 + sVar5 * lVar14);
      }
      lVar14 = lVar14 + 8;
    }
    lVar11 = lVar11 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet AlphaVectorPlanning::CrossSum(const VectorSet &A,
                                        const VectorSet &B) const
{
    int nrInA=A.size1(),
        nrInB=B.size1(),
        nrS=A.size2();

#if DEBUG_AlphaVectorPlanning_CrossSum
    cout << "AlphaVectorPlanning::CrossSum of " << nrInA 
         << " times " << nrInB << endl;
#endif

    VectorSet C(nrInA*nrInB,nrS);
    
    int k=-1;
    for(int i=0;i!=nrInA;i++)
        for(int j=0;j!=nrInB;j++)
        {
            k++;
            for(int s=0;s!=nrS;s++)
                C(k,s)=A(i,s)+B(j,s);
        }

    return(C);
}